

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O0

xcore_reg XCore_reg_id(char *name)

{
  int iVar1;
  char *in_RDI;
  int i;
  uint local_14;
  
  local_14 = 1;
  while( true ) {
    if (0x19 < local_14) {
      return XCORE_REG_INVALID;
    }
    iVar1 = strcmp(in_RDI,reg_name_maps[(int)local_14].name);
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  return reg_name_maps[(int)local_14].id;
}

Assistant:

xcore_reg XCore_reg_id(char *name)
{
	int i;

	for(i = 1; i < ARR_SIZE(reg_name_maps); i++) {
		if (!strcmp(name, reg_name_maps[i].name))
			return reg_name_maps[i].id;
	}

	// not found
	return 0;
}